

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::BP5Writer::BP5Writer(BP5Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  Comm *comm_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  ScopedTimer __var243;
  Comm local_88;
  ScopedTimer local_80;
  MPIChain *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  FileDrainerSingleThread *local_60;
  BP5Serializer *local_58;
  string local_50;
  
  (this->super_BP5Engine).m_RankMPI = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_buckets =
       &(this->super_BP5Engine).m_MetadataIndexTable._M_h._M_single_bucket;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_bucket_count = 1;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_element_count = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_BP5Engine).m_MetadataIndexTable._M_h._M_single_bucket = (__node_base_ptr)0x0;
  adios2::format::BufferSTL::BufferSTL(&(this->super_BP5Engine).m_MetadataIndex);
  (this->super_BP5Engine).UseBufferV = ChunkVType;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.BurstBufferPath.field_2;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.BurstBufferPath.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.SelectSteps._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.SelectSteps.field_2;
  (this->super_BP5Engine).m_Parameters.SelectSteps._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.SelectSteps.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.RemoteDataPath._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.RemoteDataPath.field_2;
  (this->super_BP5Engine).m_Parameters.RemoteDataPath._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.RemoteDataPath.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.RemoteHost._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.RemoteHost.field_2;
  (this->super_BP5Engine).m_Parameters.RemoteHost._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.RemoteHost.field_2._M_local_buf[0] = '\0';
  (this->super_BP5Engine).m_Parameters.UUID._M_dataplus._M_p =
       (pointer)&(this->super_BP5Engine).m_Parameters.UUID.field_2;
  (this->super_BP5Engine).m_Parameters.UUID._M_string_length = 0;
  (this->super_BP5Engine).m_Parameters.UUID.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP5Writer","");
  helper::Comm::Comm(&local_88,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_88);
  helper::Comm::~Comm(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP5Writer_0087fd08;
  adios2::format::BP5Serializer::BP5Serializer(&this->m_BP5Serializer);
  comm_00 = &(this->super_Engine).m_Comm;
  local_58 = &this->m_BP5Serializer;
  transportman::TransportMan::TransportMan(&this->m_FileDataManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetadataManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetadataIndexManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetaMetadataManager,io,comm_00);
  this->m_WriterStep = 0;
  this->m_IsFirstStep = true;
  this->m_WriteToBB = false;
  this->m_DrainBB = true;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread(&this->m_FileDrainer);
  paVar1 = &(this->m_BBName).field_2;
  (this->m_BBName)._M_dataplus._M_p = (pointer)paVar1;
  (this->m_BBName)._M_string_length = 0;
  (this->m_BBName).field_2._M_local_buf[0] = '\0';
  memset(&this->m_SubStreamNames,0,0xc0);
  local_70 = &this->m_SubStreamNames;
  local_68 = paVar1;
  local_60 = &this->m_FileDrainer;
  aggregator::MPIShmChain::MPIShmChain(&this->m_AggregatorTwoLevelShm);
  aggregator::MPIChain::MPIChain(&this->m_AggregatorEveroneWrites);
  this->m_IAmDraining = false;
  this->m_IAmWritingData = false;
  local_78 = &this->m_AggregatorEveroneWrites;
  helper::Comm::Comm(&this->m_CommAggregators);
  aggregator::MPIChain::MPIChain(&this->m_AggregatorMetadata);
  helper::Comm::Comm(&this->m_CommMetadataAggregators);
  profiling::JSONProfiler::JSONProfiler(&this->m_Profiler,comm_00);
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_DataPos = 0;
  this->m_ThisTimestepDataSize = 0;
  this->m_MetaDataPos = 0;
  this->m_StartDataPos = 0;
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_MarshalAttributesNecessary = true;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_InComputationBlock = false;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_LastTimeBetweenSteps).__r = 0.0;
  (this->m_TotalTimeBetweenSteps).__r = 0.0;
  (this->m_AvgTimeBetweenSteps).__r = 0.0;
  (this->m_ExpectedTimeBetweenSteps).__r = 0.0;
  (this->m_EndStepEnd).__d.__r = 0.0;
  (this->m_EngineStart).__d.__r = 0.0;
  (this->m_BeginStepStart).__d.__r = 0.0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ComputationBlocksLength = 0.0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ComputationBlockStart).__d.__r = 0.0;
  this->m_ComputationBlockID = 0;
  shm::Spinlock::Spinlock(&this->m_AsyncWriteLock);
  lVar3 = std::chrono::_V2::steady_clock::now();
  (this->m_EngineStart).__d.__r = (double)lVar3;
  if (BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var43 == '\0') {
    iVar2 = __cxa_guard_acquire(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var43);
    if (iVar2 != 0) {
      BP5Writer::__var43 = (void *)ps_timer_create_("BP5Writer::Open");
      __cxa_guard_release(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var43);
    }
  }
  local_80.m_timer = BP5Writer::__var43;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  ((this->super_Engine).m_IO)->m_ReadStreaming = false;
  Init(this);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_80);
  return;
}

Assistant:

BP5Writer::BP5Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP5Writer", io, name, mode, std::move(comm)), m_BP5Serializer(),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileMetaMetadataManager(io, m_Comm), m_Profiler(m_Comm)
{
    m_EngineStart = Now();
    PERFSTUBS_SCOPED_TIMER("BP5Writer::Open");
    m_IO.m_ReadStreaming = false;

    Init();
    m_IsOpen = true;
}